

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-pool.c
# Opt level: O0

MMDB_entry_data_list_s * data_pool_to_list(MMDB_data_pool_s *pool)

{
  MMDB_entry_data_list_s *pMVar1;
  MMDB_entry_data_list_s *last;
  MMDB_entry_data_list_s *cur;
  size_t j;
  size_t size;
  MMDB_entry_data_list_s *block;
  size_t i;
  MMDB_data_pool_s *pool_local;
  
  if (pool == (MMDB_data_pool_s *)0x0) {
    pool_local = (MMDB_data_pool_s *)0x0;
  }
  else if ((pool->index == 0) && (pool->used == 0)) {
    pool_local = (MMDB_data_pool_s *)0x0;
  }
  else {
    for (block = (MMDB_entry_data_list_s *)0x0; block <= (MMDB_entry_data_list_s *)pool->index;
        block = (MMDB_entry_data_list_s *)&(block->entry_data).field_0x1) {
      pMVar1 = pool->blocks[(long)block];
      j = pool->sizes[(long)block];
      if (block == (MMDB_entry_data_list_s *)pool->index) {
        j = pool->used;
      }
      for (cur = (MMDB_entry_data_list_s *)0x0; cur < (MMDB_entry_data_list_s *)(j - 1);
          cur = (MMDB_entry_data_list_s *)&(cur->entry_data).field_0x1) {
        pMVar1[(long)cur].next = pMVar1 + (long)&(cur->entry_data).field_0x1;
      }
      if (block < (MMDB_entry_data_list_s *)pool->index) {
        pMVar1[j - 1].next = pool->blocks[(long)&(block->entry_data).field_0x1];
      }
    }
    pool_local = (MMDB_data_pool_s *)pool->blocks[0];
  }
  return (MMDB_entry_data_list_s *)pool_local;
}

Assistant:

MMDB_entry_data_list_s *data_pool_to_list(MMDB_data_pool_s *const pool) {
    if (!pool) {
        return NULL;
    }

    if (pool->index == 0 && pool->used == 0) {
        return NULL;
    }

    for (size_t i = 0; i <= pool->index; i++) {
        MMDB_entry_data_list_s *const block = pool->blocks[i];

        size_t size = pool->sizes[i];
        if (i == pool->index) {
            size = pool->used;
        }

        for (size_t j = 0; j < size - 1; j++) {
            MMDB_entry_data_list_s *const cur = block + j;
            cur->next = block + j + 1;
        }

        if (i < pool->index) {
            MMDB_entry_data_list_s *const last = block + size - 1;
            last->next = pool->blocks[i + 1];
        }
    }

    return pool->blocks[0];
}